

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

void __thiscall pbrt::SampledWavelengths::TerminateSecondary(SampledWavelengths *this)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = SecondaryTerminated(this);
  if (!bVar1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      (this->pdf).values[lVar2 + 1] = 0.0;
    }
    (this->pdf).values[0] = (this->pdf).values[0] * 0.25;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void TerminateSecondary() {
        if (SecondaryTerminated())
            return;
        // Update wavelength probabilities for termination
        for (int i = 1; i < NSpectrumSamples; ++i)
            pdf[i] = 0;
        pdf[0] /= NSpectrumSamples;
    }